

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O1

int libwebvtt::Parser::ParseTime(string *line,size_type *idx_ptr,Time *time)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  size_type sVar8;
  
  if (idx_ptr == (size_type *)0x0) {
    return -1;
  }
  if (*idx_ptr == 0xffffffffffffffff) {
    return -1;
  }
  if (time == (Time *)0x0) {
    return -1;
  }
  if (line->_M_string_length <= *idx_ptr) {
    return -1;
  }
  pcVar2 = (line->_M_dataplus)._M_p;
  sVar8 = *idx_ptr;
  while( true ) {
    cVar1 = pcVar2[sVar8];
    if ((cVar1 != ' ') && (cVar1 != '\t')) break;
    *idx_ptr = sVar8 + 1;
    sVar8 = sVar8 + 1;
  }
  uVar4 = ParseNumber(line,idx_ptr);
  if ((int)uVar4 < 0) {
    return uVar4;
  }
  if ((line->_M_dataplus)._M_p[*idx_ptr] != ':') {
    time->seconds = uVar4 % 0x3c;
    time->hours = uVar4 / 0xe10;
    time->minutes = (uVar4 / 0xe10) * -0x3c + uVar4 / 0x3c;
    goto LAB_00103e3e;
  }
  *idx_ptr = *idx_ptr + 1;
  iVar5 = ParseNumber(line,idx_ptr);
  if (iVar5 < 0) {
LAB_00103e1c:
    bVar3 = false;
  }
  else {
    if (iVar5 < 0x3c) {
      sVar8 = *idx_ptr;
      if ((line->_M_dataplus)._M_p[sVar8] == ':') {
        time->hours = uVar4;
        time->minutes = iVar5;
        *idx_ptr = sVar8 + 1;
        iVar5 = ParseNumber(line,idx_ptr);
        if (iVar5 < 0) goto LAB_00103e1c;
        if (iVar5 < 0x3c) goto LAB_00103e31;
      }
      else if ((int)uVar4 < 0x3c) {
        time->hours = 0;
        time->minutes = uVar4;
LAB_00103e31:
        time->seconds = iVar5;
        bVar3 = true;
        goto LAB_00103e37;
      }
    }
    bVar3 = false;
    iVar5 = -1;
  }
LAB_00103e37:
  if (!bVar3) {
    return iVar5;
  }
LAB_00103e3e:
  iVar5 = 0;
  if ((line->_M_dataplus)._M_p[*idx_ptr] == '.') {
    *idx_ptr = *idx_ptr + 1;
    iVar6 = ParseNumber(line,idx_ptr);
    if (iVar6 < 0) {
      return iVar6;
    }
    if (999 < iVar6) {
      return -1;
    }
    if (iVar6 < 10) {
      iVar5 = iVar6 * 100;
    }
    else {
      iVar5 = iVar6 * 10;
      if (99 < iVar6) {
        iVar5 = iVar6;
      }
    }
  }
  time->milliseconds = iVar5;
  uVar7 = (ulong)(byte)(line->_M_dataplus)._M_p[*idx_ptr];
  if (0x20 < uVar7) {
    return -1;
  }
  if ((0x100000201U >> (uVar7 & 0x3f) & 1) != 0) {
    return 0;
  }
  return -1;
}

Assistant:

int Parser::ParseTime(const std::string& line, std::string::size_type* idx_ptr,
                      Time* time) {
  if (idx_ptr == NULL)
    return -1;

  std::string::size_type& idx = *idx_ptr;

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  if (time == NULL)
    return -1;

  // Consume any whitespace that precedes the timestamp.

  while (char c = line[idx]) {
    if (c != kSPACE && c != kTAB)
      break;
    ++idx;
  }

  // WebVTT timestamp syntax comes in three flavors:
  //  SS[.sss]
  //  MM:SS[.sss]
  //  HH:MM:SS[.sss]

  // Parse a generic number value.  We don't know which component
  // of the time we have yet, until we do more parsing.

  int val = ParseNumber(line, &idx);

  if (val < 0)  // error
    return val;

  Time& t = *time;

  // The presence of a colon character indicates that we have
  // an [HH:]MM:SS style syntax.

  if (line[idx] == ':') {
    // We have either HH:MM:SS or MM:SS

    // The value we just parsed is either the hours or minutes.
    // It must be followed by another number value (that is
    // either minutes or seconds).

    const int first_val = val;

    ++idx;  // consume colon

    // Parse second value

    val = ParseNumber(line, &idx);

    if (val < 0)
      return val;

    if (val >= 60)  // either MM or SS
      return -1;

    if (line[idx] == ':') {
      // We have HH:MM:SS

      t.hours = first_val;
      t.minutes = val;  // vetted above

      ++idx;  // consume MM:SS colon

      // We have parsed the hours and minutes.
      // We must now parse the seconds.

      val = ParseNumber(line, &idx);

      if (val < 0)
        return val;

      if (val >= 60)  // SS part of HH:MM:SS
        return -1;

      t.seconds = val;
    } else {
      // We have MM:SS

      // The implication here is that the hour value was omitted
      // from the timestamp (because it was 0).

      if (first_val >= 60)  // minutes
        return -1;

      t.hours = 0;
      t.minutes = first_val;
      t.seconds = val;  // vetted above
    }
  } else {
    // We have SS (only)

    // The time is expressed as total number of seconds,
    // so the seconds value has no upper bound.

    t.seconds = val;

    // Convert SS to HH:MM:SS

    t.minutes = t.seconds / 60;
    t.seconds -= t.minutes * 60;

    t.hours = t.minutes / 60;
    t.minutes -= t.hours * 60;
  }

  // We have parsed the hours, minutes, and seconds.
  // We must now parse the milliseconds.

  char c = line[idx];

  // TODO(matthewjheaney): one option here is to slightly relax the
  // syntax rules for WebVTT timestamps, to permit the comma character
  // to also be used as the seconds/milliseconds separator.  This
  // would handle streams that use localization conventions for
  // countries in Western Europe.  For now we obey the rules specified
  // in the WebVTT spec (allow "full stop" only).

  const bool have_milliseconds = (c == '.');

  if (!have_milliseconds) {
    t.milliseconds = 0;
  } else {
    ++idx;  // consume FULL STOP

    val = ParseNumber(line, &idx);

    if (val < 0)
      return val;

    if (val >= 1000)
      return -1;

    if (val < 10)
      t.milliseconds = val * 100;
    else if (val < 100)
      t.milliseconds = val * 10;
    else
      t.milliseconds = val;
  }

  // We have parsed the time proper.  We must check for any
  // junk that immediately follows the time specifier.

  c = line[idx];

  if (c != kNUL && c != kSPACE && c != kTAB)
    return -1;

  return 0;  // success
}